

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad4d_avx2.c
# Opt level: O0

void aom_sad_skip_64x16x4d_avx2
               (uint8_t *src,int src_stride,uint8_t **ref,int ref_stride,uint32_t *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  undefined1 (*pauVar7) [32];
  int in_ECX;
  long *in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  uint8_t *ref3;
  uint8_t *ref2;
  uint8_t *ref1;
  uint8_t *ref0;
  int j;
  int i;
  __m256i sum_ref3;
  __m256i sum_ref2;
  __m256i sum_ref1;
  __m256i sum_ref0;
  __m256i ref3_reg;
  __m256i ref2_reg;
  __m256i ref1_reg;
  __m256i ref0_reg;
  __m256i src_reg;
  __m128i sum;
  __m256i sum_ref0123;
  __m256i sum_ref23;
  __m256i sum_ref01;
  long local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  int local_688;
  int local_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  long local_530;
  undefined8 local_250;
  undefined8 uStack_248;
  
  iVar6 = in_ECX * 2;
  local_690 = *in_RDX;
  local_698 = in_RDX[1];
  local_6a0 = in_RDX[2];
  local_6a8 = in_RDX[3];
  local_620 = ZEXT1632(ZEXT816(0));
  local_660 = ZEXT1632(ZEXT816(0));
  local_640 = ZEXT1632(ZEXT816(0) << 0x40);
  local_680 = ZEXT1632(ZEXT816(0));
  local_530 = in_RDI;
  for (local_684 = 0; local_684 < 8; local_684 = local_684 + 1) {
    for (local_688 = 0; local_688 < 0x40; local_688 = local_688 + 0x20) {
      pauVar7 = (undefined1 (*) [32])(local_530 + local_688);
      auVar2 = vpsadbw_avx2(*(undefined1 (*) [32])(local_690 + local_688),*pauVar7);
      auVar3 = vpsadbw_avx2(*(undefined1 (*) [32])(local_698 + local_688),*pauVar7);
      auVar4 = vpsadbw_avx2(*(undefined1 (*) [32])(local_6a0 + local_688),*pauVar7);
      auVar5 = vpsadbw_avx2(*(undefined1 (*) [32])(local_6a8 + local_688),*pauVar7);
      local_620 = vpaddd_avx2(local_620,auVar2);
      local_640 = vpaddd_avx2(local_640,auVar3);
      local_660 = vpaddd_avx2(local_660,auVar4);
      local_680 = vpaddd_avx2(local_680,auVar5);
    }
    local_530 = local_530 + in_ESI * 2;
    local_690 = local_690 + iVar6;
    local_698 = local_698 + iVar6;
    local_6a0 = local_6a0 + iVar6;
    local_6a8 = local_6a8 + iVar6;
  }
  auVar2 = vshufps_avx(local_620,local_640,0x88);
  auVar3 = vshufps_avx(local_660,local_680,0x88);
  auVar2 = vphaddd_avx2(auVar2,auVar3);
  auVar1 = vpaddd_avx(auVar2._0_16_,auVar2._16_16_);
  local_250 = auVar1._0_8_;
  uStack_248 = auVar1._8_8_;
  *(undefined8 *)in_R8 = local_250;
  *(undefined8 *)(in_R8 + 2) = uStack_248;
  *in_R8 = *in_R8 << 1;
  in_R8[1] = in_R8[1] << 1;
  in_R8[2] = in_R8[2] << 1;
  in_R8[3] = in_R8[3] << 1;
  return;
}

Assistant:

static AOM_FORCE_INLINE void aom_sad16xNx3d_avx2(int N, const uint8_t *src,
                                                 int src_stride,
                                                 const uint8_t *const ref[4],
                                                 int ref_stride,
                                                 uint32_t res[4]) {
  __m256i src_reg, ref0_reg, ref1_reg, ref2_reg;
  __m256i sum_ref0, sum_ref1, sum_ref2;
  const uint8_t *ref0, *ref1, *ref2;
  const __m256i zero = _mm256_setzero_si256();
  assert(N % 2 == 0);

  ref0 = ref[0];
  ref1 = ref[1];
  ref2 = ref[2];
  sum_ref0 = _mm256_setzero_si256();
  sum_ref2 = _mm256_setzero_si256();
  sum_ref1 = _mm256_setzero_si256();

  for (int i = 0; i < N; i += 2) {
    // load src and all refs
    src_reg = yy_loadu2_128(src + src_stride, src);
    ref0_reg = yy_loadu2_128(ref0 + ref_stride, ref0);
    ref1_reg = yy_loadu2_128(ref1 + ref_stride, ref1);
    ref2_reg = yy_loadu2_128(ref2 + ref_stride, ref2);

    // sum of the absolute differences between every ref-i to src
    ref0_reg = _mm256_sad_epu8(ref0_reg, src_reg);
    ref1_reg = _mm256_sad_epu8(ref1_reg, src_reg);
    ref2_reg = _mm256_sad_epu8(ref2_reg, src_reg);

    // sum every ref-i
    sum_ref0 = _mm256_add_epi32(sum_ref0, ref0_reg);
    sum_ref1 = _mm256_add_epi32(sum_ref1, ref1_reg);
    sum_ref2 = _mm256_add_epi32(sum_ref2, ref2_reg);

    src += 2 * src_stride;
    ref0 += 2 * ref_stride;
    ref1 += 2 * ref_stride;
    ref2 += 2 * ref_stride;
  }

  aggregate_and_store_sum(res, &sum_ref0, &sum_ref1, &sum_ref2, &zero);
}